

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O1

DdNode * RAbuildSubset(DdManager *dd,DdNode *node,ApproxInfo *info)

{
  int *piVar1;
  DdHalfWord DVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  ulong uVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  NodeData *infoN;
  char *local_40;
  DdNode *local_38;
  
  pDVar9 = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (pDVar9->index == 0x7fffffff) {
    return node;
  }
  uVar7 = (ulong)((uint)node & 1);
  pDVar8 = (DdNode *)((ulong)(pDVar9->type).kids.T ^ uVar7);
  pDVar6 = (DdNode *)((ulong)(pDVar9->type).kids.E ^ uVar7);
  iVar3 = st__lookup(info->table,(char *)pDVar9,&local_40);
  if (iVar3 == 0) {
    fwrite("Something is wrong, ought to be in info table\n",0x2e,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INTERNAL_ERROR;
    return (DdNode *)0x0;
  }
  if (pDVar9 == node) {
    pDVar4 = *(DdNode **)(local_40 + 0x18);
  }
  else {
    pDVar4 = *(DdNode **)(local_40 + 0x20);
  }
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  switch(local_40[0x15]) {
  case '\x01':
    goto LAB_007bfc91;
  case '\x02':
    pDVar6 = pDVar8;
LAB_007bfc91:
    pDVar9 = RAbuildSubset(dd,pDVar6,info);
    return pDVar9;
  case '\x03':
    return info->zero;
  case '\x04':
    pDVar9 = (pDVar9->type).kids.T;
    DVar2 = pDVar9->index;
    pDVar6 = info->zero;
    pDVar8 = RAbuildSubset(dd,(DdNode *)(uVar7 ^ (ulong)(pDVar9->type).kids.T),info);
    if (pDVar8 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    pDVar9 = (DdNode *)((ulong)pDVar8 & 0xfffffffffffffffe);
    pDVar9->ref = pDVar9->ref + 1;
    if (((ulong)pDVar8 & 1) == 0) {
      pDVar4 = pDVar8;
      if (pDVar8 != pDVar6) {
        pDVar4 = cuddUniqueInter(dd,DVar2,pDVar8,pDVar6);
      }
      pDVar9 = pDVar8;
      if (pDVar4 != (DdNode *)0x0) {
LAB_007bfd45:
        piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar4;
      }
    }
    else {
      pDVar4 = pDVar9;
      if (pDVar9 != (DdNode *)((ulong)pDVar6 ^ 1)) {
        pDVar4 = cuddUniqueInter(dd,DVar2,pDVar9,(DdNode *)((ulong)pDVar6 ^ 1));
      }
      pDVar8 = pDVar9;
      if (pDVar4 != (DdNode *)0x0) {
        pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
        goto LAB_007bfd45;
      }
    }
    break;
  case '\x05':
    pDVar9 = (pDVar9->type).kids.T;
    DVar2 = pDVar9->index;
    pDVar6 = info->one;
    pDVar9 = RAbuildSubset(dd,(DdNode *)(uVar7 ^ (ulong)(pDVar9->type).kids.E),info);
    if (pDVar9 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar8 = (DdNode *)((ulong)pDVar9 ^ 1);
    if (pDVar6 != pDVar8) {
      pDVar6 = cuddUniqueInter(dd,DVar2,pDVar6,pDVar8);
    }
    if (pDVar6 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return (DdNode *)((ulong)pDVar6 ^ 1);
    }
    break;
  default:
    pDVar8 = RAbuildSubset(dd,pDVar8,info);
    if (pDVar8 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    local_38 = (DdNode *)((ulong)pDVar8 & 0xfffffffffffffffe);
    local_38->ref = local_38->ref + 1;
    pDVar4 = RAbuildSubset(dd,pDVar6,info);
    pDVar6 = local_38;
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      if (((ulong)pDVar8 & 1) == 0) {
        pDVar5 = pDVar8;
        if (pDVar8 != pDVar4) {
          pDVar5 = cuddUniqueInter(dd,pDVar9->index,pDVar8,pDVar4);
        }
        pDVar6 = pDVar8;
        if (pDVar5 != (DdNode *)0x0) {
LAB_007bfd7f:
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          if (pDVar9 == node) {
            *(DdNode **)(local_40 + 0x18) = pDVar5;
            return pDVar5;
          }
          *(DdNode **)(local_40 + 0x20) = pDVar5;
          return pDVar5;
        }
      }
      else {
        pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
        pDVar5 = local_38;
        if (local_38 != pDVar4) {
          pDVar5 = cuddUniqueInter(dd,pDVar9->index,local_38,pDVar4);
        }
        pDVar8 = pDVar6;
        if (pDVar5 != (DdNode *)0x0) {
          pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
          goto LAB_007bfd7f;
        }
      }
      Cudd_RecursiveDeref(dd,pDVar4);
    }
  }
  Cudd_RecursiveDeref(dd,pDVar8);
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
RAbuildSubset(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  ApproxInfo * info /* node info */)
{
    DdNode *Nt, *Ne, *N, *t, *e, *r;
    NodeData *infoN;

    if (Cudd_IsConstant(node))
        return(node);

    N = Cudd_Regular(node);

    Nt = Cudd_NotCond(cuddT(N), Cudd_IsComplement(node));
    Ne = Cudd_NotCond(cuddE(N), Cudd_IsComplement(node));

    if ( st__lookup(info->table, (const char *)N, (char **)&infoN)) {
        if (N == node ) {
            if (infoN->resultP != NULL) {
                return(infoN->resultP);
            }
        } else {
            if (infoN->resultN != NULL) {
                return(infoN->resultN);
            }
        }
        if (infoN->replace == REPLACE_T) {
            r = RAbuildSubset(dd, Ne, info);
            return(r);
        } else if (infoN->replace == REPLACE_E) {
            r = RAbuildSubset(dd, Nt, info);
            return(r);
        } else if (infoN->replace == REPLACE_N) {
            return(info->zero);
        } else if (infoN->replace == REPLACE_TT) {
            DdNode *Ntt = Cudd_NotCond(cuddT(cuddT(N)),
                                       Cudd_IsComplement(node));
            int index = cuddT(N)->index;
            e = info->zero;
            t = RAbuildSubset(dd, Ntt, info);
            if (t == NULL) {
                return(NULL);
            }
            cuddRef(t);
            if (Cudd_IsComplement(t)) {
                t = Cudd_Not(t);
                e = Cudd_Not(e);
                r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
                if (r == NULL) {
                    Cudd_RecursiveDeref(dd, t);
                    return(NULL);
                }
                r = Cudd_Not(r);
            } else {
                r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
                if (r == NULL) {
                    Cudd_RecursiveDeref(dd, t);
                    return(NULL);
                }
            }
            cuddDeref(t);
            return(r);
        } else if (infoN->replace == REPLACE_TE) {
            DdNode *Nte = Cudd_NotCond(cuddE(cuddT(N)),
                                       Cudd_IsComplement(node));
            int index = cuddT(N)->index;
            t = info->one;
            e = RAbuildSubset(dd, Nte, info);
            if (e == NULL) {
                return(NULL);
            }
            cuddRef(e);
            e = Cudd_Not(e);
            r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
            if (r == NULL) {
                Cudd_RecursiveDeref(dd, e);
                return(NULL);
            }
            r =Cudd_Not(r);
            cuddDeref(e);
            return(r);
        }
    } else {
        (void) fprintf(dd->err,
                       "Something is wrong, ought to be in info table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }

    t = RAbuildSubset(dd, Nt, info);
    if (t == NULL) {
        return(NULL);
    }
    cuddRef(t);

    e = RAbuildSubset(dd, Ne, info);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    if (Cudd_IsComplement(t)) {
        t = Cudd_Not(t);
        e = Cudd_Not(e);
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        r = Cudd_Not(r);
    } else {
        r = (t == e) ? t : cuddUniqueInter(dd, N->index, t, e);
        if (r == NULL) {
            Cudd_RecursiveDeref(dd, e);
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
    }
    cuddDeref(t);
    cuddDeref(e);

    if (N == node) {
        infoN->resultP = r;
    } else {
        infoN->resultN = r;
    }

    return(r);

}